

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

void bc7enc_compress_block_init(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int err_1;
  int k_1;
  uint32_t high_1;
  uint32_t h_1;
  uint32_t low_1;
  uint32_t l_1;
  endpoint_err best_1;
  uint32_t lp_1;
  uint32_t hp;
  int c_1;
  int err;
  int k;
  uint32_t high;
  uint32_t h;
  uint32_t low;
  uint32_t l;
  endpoint_err best;
  uint32_t lp;
  int c;
  
  for (c = 0; c < 0x100; c = c + 1) {
    for (lp = 0; lp < 2; lp = lp + 1) {
      best.m_error = 0xffff;
      for (l = 0; l < 0x40; l = l + 1) {
        uVar1 = (l << 1 | lp) << 1;
        for (h = 0; h < 0x40; h = h + 1) {
          uVar2 = (h << 1 | lp) << 1;
          uVar2 = (uVar1 >> 7 | uVar1) * 0x2e + (uVar2 >> 7 | uVar2) * 0x12 + 0x20 >> 6;
          iVar3 = (uVar2 - c) * (uVar2 - c);
          if (iVar3 < (int)((uint)best & 0xffff)) {
            best.m_lo = (char)l;
            best.m_error = (short)iVar3;
            best.m_hi = (uint8_t)h;
          }
        }
      }
      g_bc7_mode_1_optimal_endpoints[c][lp] = best;
    }
  }
  for (c_1 = 0; c_1 < 0x100; c_1 = c_1 + 1) {
    for (hp = 0; hp < 2; hp = hp + 1) {
      for (lp_1 = 0; lp_1 < 2; lp_1 = lp_1 + 1) {
        best_1.m_error = 0xffff;
        best_1.m_lo = '\0';
        best_1.m_hi = '\0';
        for (l_1 = 0; l_1 < 0x20; l_1 = l_1 + 1) {
          uVar1 = (l_1 << 1 | lp_1) << 2;
          for (h_1 = 0; h_1 < 0x20; h_1 = h_1 + 1) {
            uVar2 = (h_1 << 1 | hp) << 2;
            uVar2 = (uVar1 >> 6 | uVar1) * 0x2b + (uVar2 >> 6 | uVar2) * 0x15 + 0x20 >> 6;
            iVar3 = (uVar2 - c_1) * (uVar2 - c_1);
            if (iVar3 < (int)((uint)best_1 & 0xffff)) {
              best_1.m_lo = (char)l_1;
              best_1.m_error = (short)iVar3;
              best_1.m_hi = (uint8_t)h_1;
            }
          }
        }
        g_bc7_mode_7_optimal_endpoints[c_1][hp][lp_1] = best_1;
      }
    }
  }
  return;
}

Assistant:

void bc7enc_compress_block_init()
{
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t lp = 0; lp < 2; lp++)
		{
			endpoint_err best;
			best.m_error = (uint16_t)UINT16_MAX;
			for (uint32_t l = 0; l < 64; l++)
			{
				uint32_t low = ((l << 1) | lp) << 1;
				low |= (low >> 7);
				for (uint32_t h = 0; h < 64; h++)
				{
					uint32_t high = ((h << 1) | lp) << 1;
					high |= (high >> 7);
					const int k = (low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6;
					const int err = (k - c) * (k - c);
					if (err < best.m_error)
					{
						best.m_error = (uint16_t)err;
						best.m_lo = (uint8_t)l;
						best.m_hi = (uint8_t)h;
					}
				} // h
			} // l
			g_bc7_mode_1_optimal_endpoints[c][lp] = best;
		} // lp
	} // c

	// Mode 7: 555.1 2-bit indices 
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t hp = 0; hp < 2; hp++)
		{
			for (uint32_t lp = 0; lp < 2; lp++)
			{
				endpoint_err best;
				best.m_error = (uint16_t)UINT16_MAX;
				best.m_lo = 0;
				best.m_hi = 0;

				for (uint32_t l = 0; l < 32; l++)
				{
					uint32_t low = ((l << 1) | lp) << 2;
					low |= (low >> 6);

					for (uint32_t h = 0; h < 32; h++)
					{
						uint32_t high = ((h << 1) | hp) << 2;
						high |= (high >> 6);

						const int k = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;

						const int err = (k - c) * (k - c);
						if (err < best.m_error)
						{
							best.m_error = (uint16_t)err;
							best.m_lo = (uint8_t)l;
							best.m_hi = (uint8_t)h;
						}
					} // h
				} // l

				g_bc7_mode_7_optimal_endpoints[c][hp][lp] = best;

			} // hp

		} // lp

	} // c
}